

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_create_array_iterator(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue val;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar1;
  int iVar2;
  JSValueUnion *opaque;
  uint in_R9D;
  JSValue JVar3;
  int64_t unaff_retaddr;
  int class_id;
  JSIteratorKindEnum kind;
  JSArrayIteratorData *it;
  JSValue arr;
  JSValue enum_obj;
  int in_stack_ffffffffffffff5c;
  JSValueUnion in_stack_ffffffffffffff60;
  JSValueUnion in_stack_ffffffffffffff68;
  JSValueUnion in_stack_ffffffffffffff70;
  JSContext *in_stack_ffffffffffffff78;
  JSValueUnion local_80;
  JSContext *local_78;
  JSValueUnion local_60;
  JSContext *local_58;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffff4;
  JSValueUnion in_stack_fffffffffffffff8;
  JSValueUnion JVar5;
  
  if ((in_R9D & 4) == 0) {
    JVar3.tag = unaff_retaddr;
    JVar3.u.float64 = in_stack_fffffffffffffff8.float64;
    JVar3 = JS_ToObject((JSContext *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                        JVar3);
    in_stack_ffffffffffffff70 = JVar3.u;
    in_stack_ffffffffffffff78 = (JSContext *)JVar3.tag;
    local_60 = in_stack_ffffffffffffff70;
    local_58 = in_stack_ffffffffffffff78;
  }
  else {
    val.tag = (int64_t)in_stack_ffffffffffffff70.ptr;
    val.u.ptr = in_stack_ffffffffffffff68.ptr;
    JVar3 = JS_ToStringCheckObject((JSContext *)in_stack_ffffffffffffff60.ptr,val);
    local_80 = JVar3.u;
    local_60 = local_80;
    local_78 = (JSContext *)JVar3.tag;
    local_58 = local_78;
  }
  v_01.tag = (int64_t)local_58;
  v_01.u.float64 = local_60.float64;
  iVar2 = JS_IsException(v_01);
  if (iVar2 == 0) {
    JVar3 = JS_NewObjectClass((JSContext *)in_stack_ffffffffffffff60.ptr,in_stack_ffffffffffffff5c);
    in_stack_ffffffffffffff60 = JVar3.u;
    JVar5 = (JSValueUnion)JVar3.tag;
    in_stack_ffffffffffffff68 = JVar5;
    iVar2 = JS_IsException(JVar3);
    if (iVar2 == 0) {
      opaque = (JSValueUnion *)
               js_malloc(in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
      if (opaque != (JSValueUnion *)0x0) {
        opaque->ptr = (void *)local_60;
        opaque[1].ptr = local_58;
        opaque[2].int32 = in_R9D & 3;
        *(undefined4 *)((long)opaque + 0x14) = 0;
        JS_SetOpaque(JVar3,opaque);
        uVar4 = JVar3.u._0_4_;
        in_stack_fffffffffffffff4 = JVar3.u._4_4_;
        goto LAB_00167201;
      }
      v.tag = (int64_t)in_stack_ffffffffffffff70.ptr;
      v.u.ptr = in_stack_ffffffffffffff68.ptr;
      JS_FreeValue((JSContext *)in_stack_ffffffffffffff60.ptr,v);
    }
  }
  v_00.tag = (int64_t)in_stack_ffffffffffffff70.ptr;
  v_00.u.ptr = in_stack_ffffffffffffff68.ptr;
  JS_FreeValue((JSContext *)in_stack_ffffffffffffff60.ptr,v_00);
  uVar4 = 0;
  JVar5.float64 = 2.96439387504748e-323;
LAB_00167201:
  JVar1.u._4_4_ = in_stack_fffffffffffffff4;
  JVar1.u.int32 = uVar4;
  JVar1.tag = (int64_t)JVar5.ptr;
  return JVar1;
}

Assistant:

static JSValue js_create_array_iterator(JSContext *ctx, JSValueConst this_val,
                                        int argc, JSValueConst *argv, int magic)
{
    JSValue enum_obj, arr;
    JSArrayIteratorData *it;
    JSIteratorKindEnum kind;
    int class_id;

    kind = magic & 3;
    if (magic & 4) {
        /* string iterator case */
        arr = JS_ToStringCheckObject(ctx, this_val);
        class_id = JS_CLASS_STRING_ITERATOR;
    } else {
        arr = JS_ToObject(ctx, this_val);
        class_id = JS_CLASS_ARRAY_ITERATOR;
    }
    if (JS_IsException(arr))
        goto fail;
    enum_obj = JS_NewObjectClass(ctx, class_id);
    if (JS_IsException(enum_obj))
        goto fail;
    it = js_malloc(ctx, sizeof(*it));
    if (!it)
        goto fail1;
    it->obj = arr;
    it->kind = kind;
    it->idx = 0;
    JS_SetOpaque(enum_obj, it);
    return enum_obj;
 fail1:
    JS_FreeValue(ctx, enum_obj);
 fail:
    JS_FreeValue(ctx, arr);
    return JS_EXCEPTION;
}